

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O1

Matrix44<float> * __thiscall
Imath_3_2::Matrix44<float>::gjInverse
          (Matrix44<float> *__return_storage_ptr__,Matrix44<float> *this,bool singExc)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  ulong uVar4;
  float *pfVar5;
  float fVar6;
  undefined4 uVar7;
  float fVar8;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  float fVar12;
  long lVar13;
  invalid_argument *this_00;
  float *pfVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  float *pfVar18;
  undefined8 *puVar19;
  float *pfVar20;
  long lVar21;
  undefined4 *puVar22;
  float *pfVar23;
  undefined8 *puVar24;
  bool bVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  Matrix44<float> s;
  float local_b8 [6];
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 local_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pfVar18 = local_b8;
  local_b8[0] = 1.0;
  local_b8[1] = 0.0;
  local_b8[2] = 0.0;
  local_b8[3] = 0.0;
  local_b8[4] = 0.0;
  local_b8[5] = 1.0;
  uStack_a0 = 0;
  uStack_98 = 0;
  local_90 = 0x3f800000;
  local_8c = 0;
  uStack_88 = 0;
  uStack_84 = 0;
  uStack_80 = 0;
  local_7c = 0x3f800000;
  pfVar14 = (float *)&local_68;
  local_78 = *(undefined8 *)this->x[0];
  uStack_70 = *(undefined8 *)(this->x[0] + 2);
  local_68 = *(undefined8 *)this->x[1];
  uStack_60 = *(undefined8 *)(this->x[1] + 2);
  local_58 = *(undefined8 *)this->x[2];
  uStack_50 = *(undefined8 *)(this->x[2] + 2);
  local_48 = *(undefined8 *)this->x[3];
  uStack_40 = *(undefined8 *)(this->x[3] + 2);
  fVar26 = __return_storage_ptr__->x[0][0];
  fVar29 = __return_storage_ptr__->x[1][1];
  pfVar1 = __return_storage_ptr__->x[0] + 1;
  pfVar2 = __return_storage_ptr__->x[1] + 2;
  pfVar3 = __return_storage_ptr__->x[2] + 3;
  fVar28 = __return_storage_ptr__->x[2][2];
  fVar27 = __return_storage_ptr__->x[3][3];
  lVar13 = -3;
  puVar19 = &local_78;
  uVar15 = 0;
  do {
    if (uVar15 == 3) {
      __return_storage_ptr__->x[1][1] = fVar29;
      __return_storage_ptr__->x[2][2] = fVar28;
      __return_storage_ptr__->x[3][3] = fVar27;
      __return_storage_ptr__->x[0][0] = fVar26;
      puVar19 = &local_48;
      lVar13 = 3;
      puVar22 = &uStack_88;
      goto LAB_0014a468;
    }
    pfVar23 = (float *)(&local_78 + uVar15 * 2);
    uVar4 = uVar15 + 1;
    fVar6 = pfVar23[uVar15];
    fVar32 = -fVar6;
    if (-fVar6 <= fVar6) {
      fVar32 = fVar6;
    }
    uVar16 = uVar15 & 0xffffffff;
    pfVar20 = pfVar14;
    lVar21 = lVar13;
    do {
      fVar6 = *pfVar20;
      fVar30 = -fVar6;
      if (-fVar6 <= fVar6) {
        fVar30 = fVar6;
      }
      if (fVar32 < fVar30) {
        uVar16 = (ulong)((int)lVar21 + 4);
        fVar32 = fVar30;
      }
      pfVar20 = pfVar20 + 4;
      lVar21 = lVar21 + 1;
    } while (lVar21 != 0);
    if ((fVar32 != 0.0) || (NAN(fVar32))) {
      if (uVar15 != uVar16) {
        lVar21 = (long)(int)uVar16;
        lVar17 = 0;
        do {
          uVar7 = *(undefined4 *)((long)puVar19 + lVar17 * 4);
          *(undefined4 *)((long)puVar19 + lVar17 * 4) =
               *(undefined4 *)((long)&local_78 + lVar17 * 4 + lVar21 * 0x10);
          *(undefined4 *)((long)&local_78 + lVar17 * 4 + lVar21 * 0x10) = uVar7;
          fVar6 = pfVar18[lVar17];
          pfVar18[lVar17] = local_b8[lVar21 * 4 + lVar17];
          local_b8[lVar21 * 4 + lVar17] = fVar6;
          lVar17 = lVar17 + 1;
        } while (lVar17 != 4);
      }
      lVar21 = 0x10;
      uVar16 = uVar15;
      do {
        fVar31 = -*(float *)((long)pfVar14 + lVar21 + -0x10) / pfVar23[uVar15];
        pfVar20 = (float *)((long)puVar19 + lVar21);
        auVar33._0_4_ = *pfVar23 * fVar31 + *pfVar20;
        auVar33._4_4_ = *(float *)((long)&local_78 + uVar15 * 0x10 + 4) * fVar31 + pfVar20[1];
        auVar33._8_4_ = *(float *)(&uStack_70 + uVar15 * 2) * fVar31 + pfVar20[2];
        auVar33._12_4_ = *(float *)((long)&uStack_70 + uVar15 * 0x10 + 4) * fVar31 + pfVar20[3];
        *(undefined1 (*) [16])((long)puVar19 + lVar21) = auVar33;
        fVar6 = local_b8[uVar15 * 4 + 1];
        fVar30 = local_b8[uVar15 * 4 + 2];
        fVar8 = local_b8[uVar15 * 4 + 3];
        pfVar20 = (float *)((long)pfVar18 + lVar21);
        fVar10 = pfVar20[1];
        fVar11 = pfVar20[2];
        fVar12 = pfVar20[3];
        pfVar5 = (float *)((long)pfVar18 + lVar21);
        *pfVar5 = fVar31 * local_b8[uVar15 * 4] + *pfVar20;
        pfVar5[1] = fVar31 * fVar6 + fVar10;
        pfVar5[2] = fVar31 * fVar30 + fVar11;
        pfVar5[3] = fVar31 * fVar8 + fVar12;
        lVar21 = lVar21 + 0x10;
        uVar16 = uVar16 + 1;
      } while (uVar16 < 3);
    }
    else {
      if (singExc) {
        __return_storage_ptr__->x[1][1] = fVar29;
        __return_storage_ptr__->x[2][2] = fVar28;
        __return_storage_ptr__->x[3][3] = fVar27;
        __return_storage_ptr__->x[0][0] = fVar26;
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this_00,"Cannot invert singular matrix.");
        goto LAB_0014a61b;
      }
      pfVar1[0] = 0.0;
      pfVar1[1] = 0.0;
      *(undefined8 *)(__return_storage_ptr__->x[0] + 3) = 0;
      pfVar2[0] = 0.0;
      pfVar2[1] = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 2) + 0) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 2) + 4) = 0.0;
      *(undefined8 *)pfVar3 = 0;
      *(float *)((long)(__return_storage_ptr__->x + 3) + 4) = 0.0;
      *(float *)((long)(__return_storage_ptr__->x + 3) + 8) = 0.0;
      fVar27 = 1.0;
      fVar28 = 1.0;
      fVar29 = 1.0;
      fVar26 = 1.0;
    }
    pfVar14 = pfVar14 + 5;
    lVar13 = lVar13 + 1;
    puVar19 = puVar19 + 2;
    pfVar18 = pfVar18 + 4;
    uVar15 = uVar4;
  } while ((fVar32 != 0.0) || (NAN(fVar32)));
LAB_0014a412:
  __return_storage_ptr__->x[1][1] = fVar29;
  __return_storage_ptr__->x[2][2] = fVar28;
  __return_storage_ptr__->x[3][3] = fVar27;
  __return_storage_ptr__->x[0][0] = fVar26;
  return __return_storage_ptr__;
LAB_0014a468:
  fVar6 = *(float *)((long)&local_78 + lVar13 * 0x14);
  if ((fVar6 != 0.0) || (NAN(fVar6))) {
    auVar34._4_4_ = fVar6;
    auVar34._0_4_ = fVar6;
    auVar34._8_4_ = fVar6;
    auVar34._12_4_ = fVar6;
    auVar34 = divps(*(undefined1 (*) [16])(&local_78 + lVar13 * 2),auVar34);
    *(undefined1 (*) [16])(&local_78 + lVar13 * 2) = auVar34;
    auVar9._4_4_ = fVar6;
    auVar9._0_4_ = fVar6;
    auVar9._8_4_ = fVar6;
    auVar9._12_4_ = fVar6;
    auVar34 = divps(*(undefined1 (*) [16])(local_b8 + lVar13 * 4),auVar9);
    *(undefined1 (*) [16])(local_b8 + lVar13 * 4) = auVar34;
    if (lVar13 != 0) {
      lVar21 = 0;
      pfVar18 = local_b8;
      puVar24 = &local_78;
      do {
        fVar32 = -*(float *)((long)&local_78 + lVar13 * 4 + lVar21 * 0x10);
        lVar17 = 0;
        do {
          fVar30 = *(float *)((long)puVar22 + lVar17);
          fVar8 = *(float *)((long)pfVar18 + lVar17);
          *(float *)((long)puVar24 + lVar17) =
               *(float *)((long)puVar19 + lVar17) * fVar32 + *(float *)((long)puVar24 + lVar17);
          *(float *)((long)pfVar18 + lVar17) = fVar30 * fVar32 + fVar8;
          lVar17 = lVar17 + 4;
        } while (lVar17 != 0x10);
        lVar21 = lVar21 + 1;
        puVar24 = puVar24 + 2;
        pfVar18 = pfVar18 + 4;
      } while (lVar21 != lVar13);
    }
  }
  else {
    if (singExc) {
      __return_storage_ptr__->x[1][1] = fVar29;
      __return_storage_ptr__->x[2][2] = fVar28;
      __return_storage_ptr__->x[3][3] = fVar27;
      __return_storage_ptr__->x[0][0] = fVar26;
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"Cannot invert singular matrix.");
LAB_0014a61b:
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    pfVar1[0] = 0.0;
    pfVar1[1] = 0.0;
    *(undefined8 *)(__return_storage_ptr__->x[0] + 3) = 0;
    pfVar2[0] = 0.0;
    pfVar2[1] = 0.0;
    *(float *)((long)(__return_storage_ptr__->x + 2) + 0) = 0.0;
    *(float *)((long)(__return_storage_ptr__->x + 2) + 4) = 0.0;
    *(undefined8 *)pfVar3 = 0;
    *(float *)((long)(__return_storage_ptr__->x + 3) + 4) = 0.0;
    *(float *)((long)(__return_storage_ptr__->x + 3) + 8) = 0.0;
    fVar27 = 1.0;
    fVar28 = 1.0;
    fVar29 = 1.0;
    fVar26 = 1.0;
  }
  if ((fVar6 == 0.0) && (!NAN(fVar6))) goto LAB_0014a412;
  puVar19 = puVar19 + -2;
  puVar22 = puVar22 + -4;
  bVar25 = lVar13 == 0;
  lVar13 = lVar13 + -1;
  if (bVar25) {
    __return_storage_ptr__->x[1][1] = fVar29;
    __return_storage_ptr__->x[2][2] = fVar28;
    __return_storage_ptr__->x[3][3] = fVar27;
    __return_storage_ptr__->x[0][0] = fVar26;
    *(ulong *)__return_storage_ptr__->x[0] = CONCAT44(local_b8[1],local_b8[0]);
    *(ulong *)(__return_storage_ptr__->x[0] + 2) = CONCAT44(local_b8[3],local_b8[2]);
    *(ulong *)__return_storage_ptr__->x[1] = CONCAT44(local_b8[5],local_b8[4]);
    *(undefined8 *)(__return_storage_ptr__->x[1] + 2) = uStack_a0;
    *(undefined8 *)__return_storage_ptr__->x[2] = uStack_98;
    *(ulong *)(__return_storage_ptr__->x[2] + 2) = CONCAT44(local_8c,local_90);
    *(ulong *)__return_storage_ptr__->x[3] = CONCAT44(uStack_84,uStack_88);
    *(ulong *)(__return_storage_ptr__->x[3] + 2) = CONCAT44(local_7c,uStack_80);
    return __return_storage_ptr__;
  }
  goto LAB_0014a468;
}

Assistant:

inline Matrix44<T>
Matrix44<T>::gjInverse (bool singExc) const
{
    int      i, j, k;
    Matrix44 s;
    Matrix44 t (*this);

    // Forward elimination

    for (i = 0; i < 3; i++)
    {
        int pivot = i;

        T pivotsize = t.x[i][i];

        if (pivotsize < 0) pivotsize = -pivotsize;

        for (j = i + 1; j < 4; j++)
        {
            T tmp = t.x[j][i];

            if (tmp < 0) tmp = -tmp;

            if (tmp > pivotsize)
            {
                pivot     = j;
                pivotsize = tmp;
            }
        }

        if (pivotsize == 0)
        {
            if (singExc)
                throw std::invalid_argument ("Cannot invert singular matrix.");

            return Matrix44 ();
        }

        if (pivot != i)
        {
            for (j = 0; j < 4; j++)
            {
                T tmp;

                tmp           = t.x[i][j];
                t.x[i][j]     = t.x[pivot][j];
                t.x[pivot][j] = tmp;

                tmp           = s.x[i][j];
                s.x[i][j]     = s.x[pivot][j];
                s.x[pivot][j] = tmp;
            }
        }

        for (j = i + 1; j < 4; j++)
        {
            T f = t.x[j][i] / t.x[i][i];

            for (k = 0; k < 4; k++)
            {
                t.x[j][k] -= f * t.x[i][k];
                s.x[j][k] -= f * s.x[i][k];
            }
        }
    }

    // Backward substitution

    for (i = 3; i >= 0; --i)
    {
        T f;

        if ((f = t.x[i][i]) == 0)
        {
            if (singExc)
                throw std::invalid_argument ("Cannot invert singular matrix.");

            return Matrix44 ();
        }

        for (j = 0; j < 4; j++)
        {
            t.x[i][j] /= f;
            s.x[i][j] /= f;
        }

        for (j = 0; j < i; j++)
        {
            f = t.x[j][i];

            for (k = 0; k < 4; k++)
            {
                t.x[j][k] -= f * t.x[i][k];
                s.x[j][k] -= f * s.x[i][k];
            }
        }
    }

    return s;
}